

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O0

int linux_kevent_wait(kqueue *kq,int nevents,timespec *ts)

{
  int __epfd;
  int iVar1;
  long lVar2;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  int nret;
  int timeout;
  timespec *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  if ((in_RDX == (undefined8 *)0x0) || ((long)in_RDX[1] % 1000000 == 0)) {
    if (in_RDX == (undefined8 *)0x0) {
      iVar1 = -1;
    }
    else {
      iVar1 = (int)*in_RDX * 1000 + (int)((long)in_RDX[1] / 1000000);
    }
  }
  else {
    iVar1 = linux_kevent_wait_hires
                      ((kqueue *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       in_stack_ffffffffffffffd0);
    if (iVar1 < 1) {
      return iVar1;
    }
    iVar1 = 0;
  }
  __epfd = *(int *)(in_RDI + 0x7c0);
  lVar2 = __tls_get_addr(&PTR_00110fd0);
  local_4 = epoll_wait(__epfd,(epoll_event *)(lVar2 + 0x1930),in_ESI,iVar1);
  if (local_4 < 0) {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int
linux_kevent_wait(struct kqueue *kq, int nevents, const struct timespec *ts)
{
    int timeout, nret;

    /* Use a high-resolution syscall if the timeout value's tv_nsec value has a resolution
     * finer than a millisecond. */
    if (ts != NULL && (ts->tv_nsec % 1000000 != 0)) {
        nret = linux_kevent_wait_hires(kq, ts);
        if (nret <= 0)
            return (nret);

        /* epoll_wait() should have ready events */
        timeout = 0;
    } else {
        /* Convert timeout to the format used by epoll_wait() */
        if (ts == NULL)
            timeout = -1;
        else
            timeout = (1000 * ts->tv_sec) + (ts->tv_nsec / 1000000);
    }

    dbg_puts("waiting for events");
    nret = epoll_wait(kqueue_epoll_fd(kq), epoll_events, nevents, timeout);
    if (nret < 0) {
        dbg_perror("epoll_wait");
        return (-1);
    }

    return (nret);
}